

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

PermuteLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_permute(NeuralNetworkLayer *this)

{
  PermuteLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x136) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x136;
    this_00 = (PermuteLayerParams *)operator_new(0x28);
    PermuteLayerParams::PermuteLayerParams(this_00);
    (this->layer_).permute_ = this_00;
  }
  return (PermuteLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::PermuteLayerParams* NeuralNetworkLayer::mutable_permute() {
  if (!has_permute()) {
    clear_layer();
    set_has_permute();
    layer_.permute_ = new ::CoreML::Specification::PermuteLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.permute)
  return layer_.permute_;
}